

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O2

void __thiscall Group::print(Group *this,int day_id)

{
  pointer pLVar1;
  ushort uVar2;
  ostream *poVar3;
  pointer pLVar4;
  size_t sVar5;
  Lesson lesson;
  Lesson local_d8;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"group_id:");
  poVar3 = std::operator<<(poVar3,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (sVar5 = 0; sVar5 != 0x2a; sVar5 = sVar5 + 1) {
    uVar2 = (ushort)sVar5 & 0xff;
    if ((char)(uVar2 % 7) == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Day: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(byte)(uVar2 / 7));
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    pLVar1 = (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar4 = (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                  super__Vector_impl_data._M_start; pLVar4 != pLVar1; pLVar4 = pLVar4 + 1) {
      Lesson::Lesson(&local_d8,pLVar4);
      if (local_d8.lesson_id == sVar5) {
        Lesson::print(&local_d8);
      }
      Lesson::~Lesson(&local_d8);
    }
  }
  return;
}

Assistant:

void Group::print(int day_id) {

    std::cout << "group_id:" << groupNumber << std::endl;

    for (int i = 0; i < 42; i++) {
        if(i % 7 == 0)
            std::cout << "Day: " << i / 7 << std::endl
                         ;
        for (auto lesson: lesson_map) {
            if(lesson.lesson_id == i) {
                lesson.print();
            }

        }
    }

}